

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31cTextureGatherTests.cpp
# Opt level: O1

GLvoid __thiscall glcts::anon_unknown_0::GatherBase::CreateTextureCube(GatherBase *this)

{
  CallLogWrapper *this_00;
  GLenum target;
  int iVar1;
  GLenum format;
  undefined4 extraout_var;
  int i;
  long lVar2;
  uint width;
  allocator_type local_99;
  undefined8 local_98;
  Vec4 *local_90;
  Vec4 depthData;
  Vec4 data [4];
  
  iVar1 = (*(this->super_TGBase).super_SubcaseBase.super_GLWrapper._vptr_GLWrapper[0x21])();
  local_98 = CONCAT44(extraout_var,iVar1);
  format = (*(this->super_TGBase).super_SubcaseBase.super_GLWrapper._vptr_GLWrapper[0x22])(this);
  this_00 = &(this->super_TGBase).super_SubcaseBase.super_GLWrapper.super_CallLogWrapper;
  glu::CallLogWrapper::glGenTextures(this_00,1,&this->tex);
  glu::CallLogWrapper::glBindTexture(this_00,0x8513,this->tex);
  iVar1 = 0;
  width = 0x20;
  do {
    lVar2 = 0;
    do {
      depthData.m_data[lVar2] = 1.0;
      lVar2 = lVar2 + 1;
    } while (lVar2 != 4);
    std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::vector
              ((vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> *)data,
               (ulong)(width * width),&depthData,&local_99);
    lVar2 = 0;
    do {
      glu::CallLogWrapper::glTexImage2D
                (this_00,*(GLenum *)((long)&DAT_01b305d0 + lVar2),iVar1,(GLint)local_98,width,width,
                 0,format,0x1406,(void *)data[0].m_data._0_8_);
      lVar2 = lVar2 + 4;
    } while (lVar2 != 0x18);
    if (data[0].m_data._0_8_ != 0) {
      operator_delete((void *)data[0].m_data._0_8_,data[1].m_data._0_8_ - data[0].m_data._0_8_);
    }
    iVar1 = iVar1 + 1;
    width = width >> 1;
  } while (iVar1 != 6);
  data[0].m_data[0] = 0.75;
  data[0].m_data[1] = 0.8125;
  data[0].m_data[2] = 0.875;
  data[0].m_data[3] = 0.9375;
  data[1].m_data[0] = 0.5;
  data[1].m_data[1] = 0.5625;
  data[1].m_data[2] = 0.625;
  data[1].m_data[3] = 0.6875;
  data[2].m_data[0] = 0.0;
  data[2].m_data[1] = 0.0625;
  data[2].m_data[2] = 0.125;
  data[2].m_data[3] = 0.1875;
  data[3].m_data[0] = 0.25;
  data[3].m_data[1] = 0.3125;
  data[3].m_data[2] = 0.375;
  data[3].m_data[3] = 0.4375;
  local_90 = &depthData;
  if (format != 0x1902) {
    local_90 = data;
  }
  depthData.m_data[0] = 0.75;
  depthData.m_data[1] = 0.5;
  depthData.m_data[2] = 0.0;
  depthData.m_data[3] = 0.25;
  lVar2 = 0;
  do {
    target = *(GLenum *)((long)&DAT_01b305d0 + lVar2);
    glu::CallLogWrapper::glTexSubImage2D(this_00,target,0,0x16,0x19,2,2,format,0x1406,local_90);
    glu::CallLogWrapper::glTexSubImage2D(this_00,target,0,0x10,10,1,1,format,0x1406,data);
    glu::CallLogWrapper::glTexSubImage2D(this_00,target,0,0xb,2,1,1,format,0x1406,data + 1);
    glu::CallLogWrapper::glTexSubImage2D(this_00,target,0,0x18,0xd,1,1,format,0x1406,data + 2);
    glu::CallLogWrapper::glTexSubImage2D(this_00,target,0,9,0xe,1,1,format,0x1406,data + 3);
    lVar2 = lVar2 + 4;
  } while (lVar2 != 0x18);
  glu::CallLogWrapper::glTexParameteri(this_00,0x8513,0x2802,0x812f);
  glu::CallLogWrapper::glTexParameteri(this_00,0x8513,0x2803,0x812f);
  glu::CallLogWrapper::glTexParameteri(this_00,0x8513,0x8072,0x812f);
  iVar1 = (int)local_98;
  if (iVar1 < 0x8814) {
    if ((iVar1 != 0x822e) && (iVar1 != 0x8230)) {
      return;
    }
  }
  else if ((1 < iVar1 - 0x8814U) && (iVar1 != 0x8cac)) {
    return;
  }
  glu::CallLogWrapper::glTexParameteri(this_00,0x8513,0x2800,0x2600);
  glu::CallLogWrapper::glTexParameteri(this_00,0x8513,0x2801,0x2700);
  return;
}

Assistant:

virtual GLvoid CreateTextureCube()
	{
		GLenum		internal_format = InternalFormat();
		GLenum		format			= Format();
		const GLint csize			= 32;
		GLint		size			= csize;

		const GLenum faces[6] = { GL_TEXTURE_CUBE_MAP_POSITIVE_X, GL_TEXTURE_CUBE_MAP_NEGATIVE_X,
								  GL_TEXTURE_CUBE_MAP_POSITIVE_Y, GL_TEXTURE_CUBE_MAP_NEGATIVE_Y,
								  GL_TEXTURE_CUBE_MAP_POSITIVE_Z, GL_TEXTURE_CUBE_MAP_NEGATIVE_Z };

		glGenTextures(1, &tex);
		glBindTexture(GL_TEXTURE_CUBE_MAP, tex);
		for (int i = 0; size > 0; ++i, size /= 2)
		{
			std::vector<Vec4> pixels(size * size, Vec4(1.0));
			for (int j = 0; j < 6; ++j)
			{
				glTexImage2D(faces[j], i, internal_format, size, size, 0, format, GL_FLOAT, &pixels[0]);
			}
		}

		Vec4 data[4] = { Vec4(12. / 16, 13. / 16, 14. / 16, 15. / 16), Vec4(8. / 16, 9. / 16, 10. / 16, 11. / 16),
						 Vec4(0. / 16, 1. / 16, 2. / 16, 3. / 16), Vec4(4. / 16, 5. / 16, 6. / 16, 7. / 16) };

		Vec4  depthData(data[0][0], data[1][0], data[2][0], data[3][0]);
		Vec4* packedData = (format == GL_DEPTH_COMPONENT) ? &depthData : data;

		for (int j = 0; j < 6; ++j)
		{
			glTexSubImage2D(faces[j], 0, 22, 25, 2, 2, format, GL_FLOAT, packedData);
			glTexSubImage2D(faces[j], 0, 16, 10, 1, 1, format, GL_FLOAT, data + 0);
			glTexSubImage2D(faces[j], 0, 11, 2, 1, 1, format, GL_FLOAT, data + 1);
			glTexSubImage2D(faces[j], 0, 24, 13, 1, 1, format, GL_FLOAT, data + 2);
			glTexSubImage2D(faces[j], 0, 9, 14, 1, 1, format, GL_FLOAT, data + 3);
		}

		glTexParameteri(GL_TEXTURE_CUBE_MAP, GL_TEXTURE_WRAP_S, GL_CLAMP_TO_EDGE);
		glTexParameteri(GL_TEXTURE_CUBE_MAP, GL_TEXTURE_WRAP_T, GL_CLAMP_TO_EDGE);
		glTexParameteri(GL_TEXTURE_CUBE_MAP, GL_TEXTURE_WRAP_R, GL_CLAMP_TO_EDGE);

		if (IsFloatingPointTexture(internal_format))
		{
			glTexParameteri(GL_TEXTURE_CUBE_MAP, GL_TEXTURE_MAG_FILTER, GL_NEAREST);
			glTexParameteri(GL_TEXTURE_CUBE_MAP, GL_TEXTURE_MIN_FILTER, GL_NEAREST_MIPMAP_NEAREST);
		}
	}